

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaping_clipper.cpp
# Opt level: O3

void __thiscall
shaping_clipper::set_margin_curve(shaping_clipper *this,int (*points) [2],int num_points)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  pointer pfVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  double dVar12;
  undefined1 auVar13 [16];
  float fVar14;
  undefined1 auVar15 [16];
  int iVar17;
  undefined1 auVar16 [16];
  
  pfVar6 = (this->margin_curve).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  *pfVar6 = (float)(*points)[1];
  iVar1 = this->size;
  iVar7 = iVar1 / 2;
  iVar9 = 0;
  if (1 < num_points) {
    uVar11 = 0;
    iVar9 = 0;
    do {
      iVar17 = iVar9;
      if (iVar9 <= iVar7) {
        iVar2 = points[uVar11 + 1][0];
        lVar10 = (long)iVar9 + -1;
        do {
          fVar14 = ((float)iVar9 * this->sample_rate) / (float)iVar1;
          iVar17 = iVar9;
          if ((float)iVar2 <= fVar14) break;
          pfVar6[lVar10 + 1] =
               (float)(((points[uVar11 + 1][1] - points[uVar11][1]) *
                       ((int)fVar14 - points[uVar11][0])) / (iVar2 - points[uVar11][0]) +
                      points[uVar11][1]);
          lVar10 = lVar10 + 1;
          iVar9 = iVar9 + 1;
          iVar17 = iVar7 + 1;
        } while (lVar10 < iVar7);
      }
      iVar9 = iVar17;
      uVar11 = uVar11 + 1;
    } while (uVar11 != num_points - 1U);
  }
  auVar5 = _DAT_0010b090;
  auVar4 = _DAT_0010b080;
  auVar3 = _DAT_0010b070;
  uVar8 = iVar7 - iVar9;
  if (iVar9 <= iVar7) {
    fVar14 = (float)points[(int)(num_points - 1U)][1];
    auVar13._4_4_ = 0;
    auVar13._0_4_ = uVar8;
    auVar13._8_4_ = uVar8;
    auVar13._12_4_ = 0;
    uVar11 = 0;
    auVar13 = auVar13 ^ _DAT_0010b090;
    do {
      auVar15._8_4_ = (int)uVar11;
      auVar15._0_8_ = uVar11;
      auVar15._12_4_ = (int)(uVar11 >> 0x20);
      auVar16 = (auVar15 | auVar4) ^ auVar5;
      iVar7 = auVar13._4_4_;
      if ((bool)(~(auVar16._4_4_ == iVar7 && auVar13._0_4_ < auVar16._0_4_ || iVar7 < auVar16._4_4_)
                & 1)) {
        pfVar6[(long)iVar9 + uVar11] = fVar14;
      }
      if ((auVar16._12_4_ != auVar13._12_4_ || auVar16._8_4_ <= auVar13._8_4_) &&
          auVar16._12_4_ <= auVar13._12_4_) {
        pfVar6[(long)iVar9 + uVar11 + 1] = fVar14;
      }
      auVar15 = (auVar15 | auVar3) ^ auVar5;
      iVar17 = auVar15._4_4_;
      if (iVar17 <= iVar7 && (iVar17 != iVar7 || auVar15._0_4_ <= auVar13._0_4_)) {
        pfVar6[(long)iVar9 + uVar11 + 2] = fVar14;
        pfVar6[(long)iVar9 + uVar11 + 3] = fVar14;
      }
      uVar11 = uVar11 + 4;
    } while (((ulong)uVar8 + 4 & 0xfffffffffffffffc) != uVar11);
  }
  if (-2 < iVar1) {
    lVar10 = -1;
    do {
      dVar12 = pow(10.0,(double)(pfVar6[lVar10 + 1] / 20.0));
      pfVar6 = (this->margin_curve).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      pfVar6[lVar10 + 1] = (float)dVar12;
      lVar10 = lVar10 + 1;
    } while (lVar10 < this->size / 2);
  }
  return;
}

Assistant:

void shaping_clipper::set_margin_curve(int points[][2], int num_points) {
    this->margin_curve[0] = points[0][1];

    int j = 0;
    for (int i = 0; i < num_points - 1; i++) {
        while (j < this->size / 2 + 1 && j * this->sample_rate / this->size < points[i + 1][0]) {
            // linearly interpolate between points
            int binHz = j * this->sample_rate / this->size;
            margin_curve[j] = points[i][1] + (binHz - points[i][0]) * (points[i + 1][1] - points[i][1]) / (points[i + 1][0] - points[i][0]);
            j++;
        }
    }
    // handle bins after the last point
    while (j < this->size / 2 + 1) {
        margin_curve[j] = points[num_points - 1][1];
        j++;
    }

    // convert margin curve to linear amplitude scale
    for (j = 0; j < this->size / 2 + 1; j++) {
        margin_curve[j] = pow(10, margin_curve[j] / 20);
    }
}